

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

unsigned_long ndiGetTXFrame(ndicapi *pol,int ph)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = pol->TxHandleCount;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
LAB_001084b7:
      if ((uint)uVar3 == uVar1) {
        return 0;
      }
      uVar2 = ndiHexToUnsignedLong(pol->TxFrame[uVar3],8);
      return uVar2;
    }
    if ((uint)pol->TxHandles[uVar4] == ph) {
      uVar3 = uVar4 & 0xffffffff;
      goto LAB_001084b7;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ndicapiExport unsigned long ndiGetTXFrame(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxFrame[i];

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}